

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_auth_manager.c
# Opt level: O0

int s5auth_manager_register_username_password_authenticator
              (s5auth_manager *auth_manager,identity *identities,size_t n)

{
  identity *piVar1;
  char *pcVar2;
  int *piVar3;
  char *local_38;
  ulong local_30;
  size_t i;
  size_t n_local;
  identity *identities_local;
  s5auth_manager *auth_manager_local;
  
  piVar1 = (identity *)calloc(n,0x1fe);
  auth_manager->identities = piVar1;
  if (auth_manager->identities == (identity *)0x0) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/yfaming[P]yimu/socks5_auth_manager.c"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_38 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/yfaming[P]yimu/socks5_auth_manager.c";
    }
    else {
      local_38 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/yfaming[P]yimu/socks5_auth_manager.c"
                         ,0x2f);
      local_38 = local_38 + 1;
    }
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    piVar3 = __errno_location();
    ymlog(3,local_38,0x29,"s5auth_manager_register_username_password_authenticator",
          "calloc() for struct identity failed: %s (errno=%d)",pcVar2,*piVar3);
    auth_manager_local._4_4_ = -1;
  }
  else {
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      strcpy(auth_manager->identities[local_30].username,identities[local_30].username);
      strcpy(auth_manager->identities[local_30].password,identities[local_30].password);
    }
    auth_manager->identities_size = n;
    auth_manager->username_password_authenticator_enabled = 1;
    auth_manager_local._4_4_ = 0;
  }
  return auth_manager_local._4_4_;
}

Assistant:

int s5auth_manager_register_username_password_authenticator(struct s5auth_manager *auth_manager,
        struct identity *identities, size_t n)
{
    auth_manager->identities = calloc(n, sizeof(struct identity));
    if (auth_manager->identities == NULL) {
        error("calloc() for struct identity failed: %s (errno=%d)", strerror(errno), errno);
        return -1;
    }
    size_t i;
    for (i = 0; i < n; i++) {
        strcpy(auth_manager->identities[i].username, identities[i].username);
        strcpy(auth_manager->identities[i].password, identities[i].password);
    }
    auth_manager->identities_size = n;
    auth_manager->username_password_authenticator_enabled = 1;
    return 0;
}